

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall
Parser::parseClass(Parser *this,Token *class_token,bool expect_class_name,bool is_local)

{
  pointer *ppEVar1;
  pointer *pppNVar2;
  int iVar3;
  TokenType TVar4;
  iterator __position;
  pointer pTVar5;
  Token *pTVar6;
  pointer ppNVar7;
  iterator iVar8;
  bool bVar9;
  Node *pNVar10;
  CompilationContext *ctx_;
  long lVar11;
  ulong uVar12;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  Node *member;
  Node *memberValue;
  Node *memberName;
  vector<Node_*,_std::allocator<Node_*>_> classMembers;
  Node *extends;
  Node *className;
  Node *local_70;
  Node *local_68;
  Node *local_60;
  Node **local_58;
  iterator iStack_50;
  Node **local_48;
  Node *local_40;
  Node *local_38;
  
  local_58 = (Node **)((ulong)local_58 & 0xffffffff00000000);
  __position._M_current =
       (this->expressionContext).
       super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->expressionContext).
      super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>::
    _M_realloc_insert<Parser::ExpressionContext>
              (&this->expressionContext,__position,(ExpressionContext *)&local_58);
  }
  else {
    *__position._M_current = EC_USUAL;
    (this->expressionContext).
    super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_38 = (Node *)0x0;
  local_40 = (Node *)0x0;
  local_48 = (Node **)0x0;
  local_58 = (Node **)0x0;
  iStack_50._M_current = (Node **)0x0;
  if (expect_class_name) {
    local_38 = parseDeref(this);
  }
  iVar3 = this->pos;
  pTVar5 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar5[iVar3].type == TK_EXTENDS) {
    this->tok = pTVar5 + iVar3;
    this->pos = iVar3 + 1;
    local_40 = parseTernaryOp(this);
  }
  checkBraceIdentationStyle(this);
  expect(this,TK_LBRACE);
  ctx_ = this->ctx;
  if (ctx_->isError == false) {
    do {
      iVar3 = this->pos;
      pTVar5 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pTVar5[iVar3].type == TK_RBRACE) {
        this->tok = pTVar5 + iVar3;
        this->pos = iVar3 + 1;
        break;
      }
      iVar3 = this->pos;
      if (pTVar5[iVar3].type == TK_SEMICOLON) {
        this->tok = pTVar5 + iVar3;
        this->pos = iVar3 + 1;
      }
      else {
        iVar3 = this->pos;
        TVar4 = pTVar5[iVar3].type;
        if (TVar4 == TK_STATIC) {
          this->tok = pTVar5 + iVar3;
          this->pos = iVar3 + 1;
LAB_0010fa02:
          iVar3 = this->pos;
          if (pTVar5[iVar3].type == TK_FUNCTION) {
            this->tok = pTVar5 + iVar3;
            this->pos = iVar3 + 1;
            local_68 = parseFunction(this,FT_CLASS_METHOD);
            if (local_68 == (Node *)0x0) {
              local_60 = (Node *)0x0;
            }
            else {
              local_60 = *(local_68->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            }
            pNVar10 = (Node *)operator_new(0x30);
            CompilationContext::Poolable::Poolable((Poolable *)pNVar10,this->ctx);
            pNVar10->tok = pTVar5 + iVar3;
            (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pNVar10->nodeType = PNT_UNKNOWN;
            pNVar10->nodeType = (TVar4 == TK_STATIC) + PNT_CLASS_MEMBER;
            iVar8._M_current =
                 (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_70 = pNVar10;
            if (iVar8._M_current ==
                (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                        ((vector<Node*,std::allocator<Node*>> *)&pNVar10->children,iVar8,&local_60);
            }
            else {
              *iVar8._M_current = local_60;
              pppNVar2 = &(pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              *pppNVar2 = *pppNVar2 + 1;
            }
            iVar8._M_current =
                 (local_70->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (local_70->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                        ((vector<Node*,std::allocator<Node*>> *)&local_70->children,iVar8,&local_68)
              ;
            }
            else {
              *iVar8._M_current = local_68;
              pppNVar2 = &(local_70->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              *pppNVar2 = *pppNVar2 + 1;
            }
            if (iStack_50._M_current != local_48) goto LAB_0010fda5;
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&local_58,iStack_50,&local_70);
          }
          else {
            iVar3 = this->pos;
            if (pTVar5[iVar3].type == TK_LSQUARE) {
              this->tok = pTVar5 + iVar3;
              this->pos = iVar3 + 1;
              pNVar10 = parseTernaryOp(this);
              local_68 = createMakeKeyNode(this,pTVar5 + iVar3,pNVar10);
              expect(this,TK_RSQUARE);
              expect(this,TK_ASSIGN);
              pTVar6 = this->tok;
              local_60 = parseTernaryOp(this);
              pNVar10 = (Node *)operator_new(0x30);
              CompilationContext::Poolable::Poolable((Poolable *)pNVar10,this->ctx);
              pNVar10->tok = pTVar6;
              (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pNVar10->nodeType = PNT_UNKNOWN;
              pNVar10->nodeType = (TVar4 == TK_STATIC) + PNT_CLASS_MEMBER;
              iVar8._M_current =
                   (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_70 = pNVar10;
              if (iVar8._M_current ==
                  (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                          ((vector<Node*,std::allocator<Node*>> *)&pNVar10->children,iVar8,&local_68
                          );
              }
              else {
                *iVar8._M_current = local_68;
                pppNVar2 = &(pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppNVar2 = *pppNVar2 + 1;
              }
              iVar8._M_current =
                   (local_70->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (local_70->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                          ((vector<Node*,std::allocator<Node*>> *)&local_70->children,iVar8,
                           &local_60);
              }
              else {
                *iVar8._M_current = local_60;
                pppNVar2 = &(local_70->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                *pppNVar2 = *pppNVar2 + 1;
              }
              if (iStack_50._M_current != local_48) goto LAB_0010fda5;
              std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                        ((vector<Node*,std::allocator<Node*>> *)&local_58,iStack_50,&local_70);
            }
            else {
              bVar9 = expect(this,TK_IDENTIFIER);
              if (bVar9) {
                local_68 = createIdentifierNode(this,this->tok);
                expect(this,TK_ASSIGN);
                pTVar6 = this->tok;
                local_60 = parseTernaryOp(this);
                pNVar10 = (Node *)operator_new(0x30);
                CompilationContext::Poolable::Poolable((Poolable *)pNVar10,this->ctx);
                pNVar10->tok = pTVar6;
                (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                pNVar10->nodeType = PNT_UNKNOWN;
                pNVar10->nodeType = (TVar4 == TK_STATIC) + PNT_CLASS_MEMBER;
                iVar8._M_current =
                     (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                local_70 = pNVar10;
                if (iVar8._M_current ==
                    (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                            ((vector<Node*,std::allocator<Node*>> *)&pNVar10->children,iVar8,
                             &local_68);
                }
                else {
                  *iVar8._M_current = local_68;
                  pppNVar2 = &(pNVar10->children).
                              super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppNVar2 = *pppNVar2 + 1;
                }
                iVar8._M_current =
                     (local_70->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (local_70->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                            ((vector<Node*,std::allocator<Node*>> *)&local_70->children,iVar8,
                             &local_60);
                }
                else {
                  *iVar8._M_current = local_60;
                  pppNVar2 = &(local_70->children).
                              super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppNVar2 = *pppNVar2 + 1;
                }
                if (iStack_50._M_current != local_48) goto LAB_0010fda5;
                std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                          ((vector<Node*,std::allocator<Node*>> *)&local_58,iStack_50,&local_70);
              }
            }
          }
        }
        else {
          iVar3 = this->pos;
          if (pTVar5[iVar3].type != TK_CONSTRUCTOR) goto LAB_0010fa02;
          this->tok = pTVar5 + iVar3;
          this->pos = iVar3 + 1;
          local_68 = parseFunction(this,FT_CLASS_CONSTRUCTOR);
          local_60 = (Node *)0x0;
          pNVar10 = (Node *)operator_new(0x30);
          CompilationContext::Poolable::Poolable((Poolable *)pNVar10,this->ctx);
          pNVar10->tok = pTVar5 + iVar3;
          (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pNVar10->nodeType = PNT_UNKNOWN;
          pNVar10->nodeType = PNT_CLASS_MEMBER;
          iVar8._M_current =
               (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_70 = pNVar10;
          if (iVar8._M_current ==
              (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&pNVar10->children,iVar8,&local_60);
          }
          else {
            *iVar8._M_current = local_60;
            pppNVar2 = &(pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppNVar2 = *pppNVar2 + 1;
          }
          iVar8._M_current =
               (local_70->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current ==
              (local_70->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&local_70->children,iVar8,&local_68);
          }
          else {
            *iVar8._M_current = local_68;
            pppNVar2 = &(local_70->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppNVar2 = *pppNVar2 + 1;
          }
          if (iStack_50._M_current == local_48) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&local_58,iStack_50,&local_70);
            goto LAB_0010fdb3;
          }
LAB_0010fda5:
          *iStack_50._M_current = local_70;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
      }
LAB_0010fdb3:
      ctx_ = this->ctx;
    } while (ctx_->isError != true);
  }
  pNVar10 = (Node *)operator_new(0x30);
  CompilationContext::Poolable::Poolable((Poolable *)pNVar10,ctx_);
  pNVar10->tok = class_token;
  this_00 = &pNVar10->children;
  (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar10->nodeType = is_local | PNT_CLASS;
  ppNVar7 = (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar7 == (pointer)0x0) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)this_00,(iterator)0x0,&local_38);
  }
  else {
    *ppNVar7 = local_38;
    pppNVar2 = &(pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar2 = *pppNVar2 + 1;
  }
  iVar8._M_current =
       (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)this_00,iVar8,&local_40);
  }
  else {
    *iVar8._M_current = local_40;
    pppNVar2 = &(pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar2 = *pppNVar2 + 1;
  }
  local_68 = (Node *)0x0;
  iVar8._M_current =
       (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
              ((vector<Node*,std::allocator<Node*>> *)this_00,iVar8,&local_68);
  }
  else {
    *iVar8._M_current = (Node *)0x0;
    pppNVar2 = &(pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar2 = *pppNVar2 + 1;
  }
  if (iStack_50._M_current != local_58) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      iVar8._M_current =
           (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)this_00,iVar8,
                   (Node **)((long)local_58 + lVar11));
      }
      else {
        *iVar8._M_current = *(Node **)((long)local_58 + lVar11);
        pppNVar2 = &(pNVar10->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar2 = *pppNVar2 + 1;
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 8;
    } while (uVar12 < (ulong)((long)iStack_50._M_current - (long)local_58 >> 3));
  }
  if (local_58 != (Node **)0x0) {
    operator_delete(local_58);
  }
  ppEVar1 = &(this->expressionContext).
             super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppEVar1 = *ppEVar1 + -1;
  return pNVar10;
}

Assistant:

Node * parseClass(Token * class_token, bool expect_class_name, bool is_local)
  {
    EXPRESSION_CONTEXT_SCOPE(EC_USUAL);

    Node * className = nullptr;
    Node * extends = nullptr;
    vector<Node *> classMembers;
    if (expect_class_name)
      className = parseDeref();

    if (accept(TK_EXTENDS))
      extends = parseTernaryOp();

    checkBraceIdentationStyle();
    expect(TK_LBRACE);

    while (!ctx.isError)
    {
      if (accept(TK_RBRACE))
        break;

      if (accept(TK_SEMICOLON))
        continue;

      bool isStatic = accept(TK_STATIC);

      if (!isStatic && accept(TK_CONSTRUCTOR))
      {
        Token * memberTok = tok;
        Node * memberValue = parseFunction(FT_CLASS_CONSTRUCTOR);
        Node * memberName = nullptr;

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (accept(TK_FUNCTION))
      {
        Token * memberTok = tok;
        Node * memberValue = parseFunction(FT_CLASS_METHOD);
        Node * memberName = memberValue ? memberValue->children[0] : nullptr;

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (accept(TK_LSQUARE))
      {
        Node * memberName = createMakeKeyNode(*tok, parseTernaryOp());
        expect(TK_RSQUARE);
        expect(TK_ASSIGN);
        Token * memberTok = tok;
        Node * memberValue = parseTernaryOp();

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
      else if (expect(TK_IDENTIFIER))
      {
        Node * memberName = createIdentifierNode(*tok);
        expect(TK_ASSIGN);
        Token * memberTok = tok;
        Node * memberValue = parseTernaryOp();

        Node * member = new Node(ctx, *memberTok);
        member->nodeType = isStatic ? PNT_STATIC_CLASS_MEMBER : PNT_CLASS_MEMBER;
        member->children.push_back(memberName);
        member->children.push_back(memberValue);
        classMembers.push_back(member);
      }
    }

    Node * res = new Node(ctx, *class_token);
    res->nodeType = is_local ? PNT_LOCAL_CLASS : PNT_CLASS;
    res->children.push_back(className);
    res->children.push_back(extends);
    res->children.push_back(nullptr); // attributes (removed code)
    for (size_t i = 0; i < classMembers.size(); i++)
      res->children.push_back(classMembers[i]);
    return res;
  }